

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

Slice leveldb::GetLengthPrefixedSlice(char *data)

{
  char *d;
  char *p;
  char *pcStack_20;
  uint32_t len;
  char *data_local;
  
  pcStack_20 = data;
  d = GetVarint32Ptr(data,data + 5,(uint32_t *)((long)&p + 4));
  Slice::Slice((Slice *)&data_local,d,(ulong)p._4_4_);
  return _data_local;
}

Assistant:

static Slice GetLengthPrefixedSlice(const char* data) {
  uint32_t len;
  const char* p = data;
  p = GetVarint32Ptr(p, p + 5, &len);  // +5: we assume "p" is not corrupted
  return Slice(p, len);
}